

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCall
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Call *curr)

{
  size_t sVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  Literal *pLVar5;
  string_view name;
  Name NVar6;
  undefined1 local_130 [8];
  Flow flow;
  anon_union_16_6_1532cd5a_for_Literal_0 local_b0 [3];
  undefined1 auStack_78 [8];
  Literals arguments;
  HeapType local_38;
  
  name = (curr->target).super_IString.str;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_130,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)auStack_78);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    NVar6.super_IString.str._M_str = (char *)(curr->target).super_IString.str._M_len;
    NVar6.super_IString.str._M_len = (size_t)this->wasm;
    lVar4 = ::wasm::Module::getFunction(NVar6);
    local_38.id = *(uintptr_t *)(lVar4 + 0x38);
    local_b0[0]._0_8_ = (this->super_ExpressionRunner<wasm::ModuleRunner>).module;
    cVar3 = ::wasm::Intrinsics::isCallWithoutEffects((Function *)&local_b0[0].func);
    if (cVar3 != '\0') {
      pLVar5 = SmallVector<wasm::Literal,_1UL>::back((SmallVector<wasm::Literal,_1UL> *)auStack_78);
      name = (string_view)Literal::getFunc(pLVar5);
      pLVar5 = SmallVector<wasm::Literal,_1UL>::back((SmallVector<wasm::Literal,_1UL> *)auStack_78);
      local_38 = Type::getHeapType(&pLVar5->type);
      SmallVector<wasm::Literal,_1UL>::pop_back((SmallVector<wasm::Literal,_1UL> *)auStack_78);
    }
    if (curr->isReturn == true) {
      Literal::Literal((Literal *)&local_b0[0].func,(Name)name,local_38);
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)auStack_78,(Literal *)&local_b0[0].func);
      ::wasm::Literal::~Literal((Literal *)&local_b0[0].func);
      pcVar2 = _compare;
      sVar1 = RETURN_CALL_FLOW;
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                 (SmallVector<wasm::Literal,_1UL> *)auStack_78);
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
    }
    else {
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,
                 (SmallVector<wasm::Literal,_1UL> *)auStack_78);
      callFunction((Literals *)&local_b0[0].func,this,(Name)name,
                   (Literals *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,(Literals *)&local_b0[0].func);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&local_b0[0].func);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_130);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_130);
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_78);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    Name target = curr->target;
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    auto* func = wasm.getFunction(curr->target);
    auto funcType = func->type;
    if (Intrinsics(*self()->getModule()).isCallWithoutEffects(func)) {
      // The call.without.effects intrinsic is a call to an import that actually
      // calls the given function reference that is the final argument.
      target = arguments.back().getFunc();
      funcType = arguments.back().type.getHeapType();
      arguments.pop_back();
    }

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      arguments.push_back(Literal::makeFunc(target, funcType));
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = callFunction(target, arguments);
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }